

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

uint rlLoadTextureCubemap(void *data,int size,int format,int mipmapCount)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  GLint GVar4;
  int iVar5;
  int width;
  char *text;
  GLenum GVar6;
  void *pvVar7;
  int iVar8;
  uint glType;
  uint glFormat;
  uint glInternalFormat;
  uint id;
  void *local_60;
  uint local_54;
  ulong local_50;
  GLint swizzleMask [4];
  
  id = 0;
  (*glad_glGenTextures)(1,&id);
  (*glad_glBindTexture)(0x8513,id);
  rlGetGlTextureFormats(format,&glInternalFormat,&glFormat,&glType);
  local_50 = (ulong)(uint)mipmapCount;
  if (0 < mipmapCount && glInternalFormat != 0) {
    iVar1 = rlGetPixelDataSize(size,size,format);
    local_54 = (int)local_50 * 6;
    if ((int)local_54 < 2) {
      local_54 = 1;
    }
    uVar3 = 0;
    width = size;
    local_60 = data;
    do {
      iVar8 = (int)uVar3;
      iVar2 = (int)(uVar3 / 6);
      iVar5 = iVar8 + iVar2 * -6;
      iVar2 = iVar2 * -6;
      GVar4 = (GLint)(uVar3 / 6);
      if (data == (void *)0x0) {
        if (format < 0xe) {
          if ((0xd < (uint)format) || ((0x2d00U >> (format & 0x1fU) & 1) == 0)) {
            GVar6 = iVar2 + iVar8 + 0x8515;
            pvVar7 = (void *)0x0;
            goto LAB_001618b9;
          }
          text = "TEXTURES: Cubemap requested format not supported";
        }
        else {
          text = "TEXTURES: Empty cubemap creation does not support compressed format";
        }
        TraceLog(4,text);
      }
      else {
        GVar6 = iVar2 + iVar8 + 0x8515;
        if (format < 0xe) {
          pvVar7 = (void *)((ulong)(uint)(iVar5 * iVar1) + (long)local_60);
LAB_001618b9:
          (*glad_glTexImage2D)(GVar6,GVar4,glInternalFormat,width,width,0,glFormat,glType,pvVar7);
        }
        else {
          (*glad_glCompressedTexImage2D)
                    (GVar6,GVar4,glInternalFormat,width,width,0,iVar1,
                     (void *)((ulong)(uint)(iVar5 * iVar1) + (long)local_60));
        }
      }
      if (format == 2) {
        swizzleMask[3] = 0x1904;
LAB_0016193f:
        swizzleMask[0] = 0x1903;
        swizzleMask[1] = 0x1903;
        swizzleMask[2] = 0x1903;
        (*glad_glTexParameteriv)(0x8513,0x8e46,swizzleMask);
      }
      else if (format == 1) {
        swizzleMask[3] = 1;
        goto LAB_0016193f;
      }
      if (iVar5 == 5) {
        width = width / 2;
        uVar3 = (ulong)(uint)(iVar1 * 6);
        if (data == (void *)0x0) {
          uVar3 = 0;
        }
        local_60 = (void *)((long)local_60 + uVar3);
        if (width < 2) {
          width = 1;
        }
        iVar1 = rlGetPixelDataSize(width,width,format);
      }
      uVar3 = (ulong)(iVar8 + 1U);
    } while (local_54 != iVar8 + 1U);
  }
  GVar4 = 0x2703;
  if ((int)local_50 < 2) {
    GVar4 = 0x2601;
  }
  (*glad_glTexParameteri)(0x8513,0x2801,GVar4);
  (*glad_glTexParameteri)(0x8513,0x2800,0x2601);
  (*glad_glTexParameteri)(0x8513,0x2802,0x812f);
  (*glad_glTexParameteri)(0x8513,0x2803,0x812f);
  (*glad_glTexParameteri)(0x8513,0x8072,0x812f);
  (*glad_glBindTexture)(0x8513,0);
  if (id == 0) {
    TraceLog(4,"TEXTURE: Failed to load cubemap texture");
  }
  else {
    TraceLog(3,"TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)",(ulong)id,
             (ulong)(uint)size,(ulong)(uint)size);
  }
  return id;
}

Assistant:

unsigned int rlLoadTextureCubemap(const void *data, int size, int format, int mipmapCount)
{
    unsigned int id = 0;

#if defined(GRAPHICS_API_OPENGL_33) || defined(GRAPHICS_API_OPENGL_ES2)
    int mipSize = size;

    // NOTE: Added pointer math separately from function to avoid UBSAN complaining
    unsigned char *dataPtr = NULL;
    if (data != NULL) dataPtr = (unsigned char *)data;

    unsigned int dataSize = rlGetPixelDataSize(size, size, format);

    glGenTextures(1, &id);
    glBindTexture(GL_TEXTURE_CUBE_MAP, id);

    unsigned int glInternalFormat, glFormat, glType;
    rlGetGlTextureFormats(format, &glInternalFormat, &glFormat, &glType);

    if (glInternalFormat != 0)
    {
        // Load cubemap faces/mipmaps
        for (int i = 0; i < 6*mipmapCount; i++)
        {
            int mipmapLevel = i/6;
            int face = i%6;

            if (data == NULL)
            {
                if (format < RL_PIXELFORMAT_COMPRESSED_DXT1_RGB)
                {
                    if ((format == RL_PIXELFORMAT_UNCOMPRESSED_R32) || 
                        (format == RL_PIXELFORMAT_UNCOMPRESSED_R32G32B32A32) ||
                        (format == RL_PIXELFORMAT_UNCOMPRESSED_R16) || 
                        (format == RL_PIXELFORMAT_UNCOMPRESSED_R16G16B16A16)) TRACELOG(RL_LOG_WARNING, "TEXTURES: Cubemap requested format not supported");
                    else glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, mipmapLevel, glInternalFormat, mipSize, mipSize, 0, glFormat, glType, NULL);
                }
                else TRACELOG(RL_LOG_WARNING, "TEXTURES: Empty cubemap creation does not support compressed format");
            }
            else
            {
                if (format < RL_PIXELFORMAT_COMPRESSED_DXT1_RGB) glTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, mipmapLevel, glInternalFormat, mipSize, mipSize, 0, glFormat, glType, (unsigned char *)dataPtr + face*dataSize);
                else glCompressedTexImage2D(GL_TEXTURE_CUBE_MAP_POSITIVE_X + face, mipmapLevel, glInternalFormat, mipSize, mipSize, 0, dataSize, (unsigned char *)dataPtr + face*dataSize);
            }

#if defined(GRAPHICS_API_OPENGL_33)
            if (format == RL_PIXELFORMAT_UNCOMPRESSED_GRAYSCALE)
            {
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ONE };
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
            else if (format == RL_PIXELFORMAT_UNCOMPRESSED_GRAY_ALPHA)
            {
#if defined(GRAPHICS_API_OPENGL_21)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_ALPHA };
#elif defined(GRAPHICS_API_OPENGL_33)
                GLint swizzleMask[] = { GL_RED, GL_RED, GL_RED, GL_GREEN };
#endif
                glTexParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, swizzleMask);
            }
#endif
            if (face == 5)
            {
                mipSize /= 2;
                if (data != NULL) dataPtr += dataSize*6; // Increment data pointer to next mipmap

                // Security check for NPOT textures
                if (mipSize < 1) mipSize = 1;

                dataSize = rlGetPixelDataSize(mipSize, mipSize, format);
            }
        }
    }

    // Set cubemap texture sampling parameters
    if (mipmapCount > 1) glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
    else glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);

    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
#if defined(GRAPHICS_API_OPENGL_33)
    glTexParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);  // Flag not supported on OpenGL ES 2.0
#endif

    glBindTexture(GL_TEXTURE_CUBE_MAP, 0);
#endif

    if (id > 0) TRACELOG(RL_LOG_INFO, "TEXTURE: [ID %i] Cubemap texture loaded successfully (%ix%i)", id, size, size);
    else TRACELOG(RL_LOG_WARNING, "TEXTURE: Failed to load cubemap texture");

    return id;
}